

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_force(char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  ulong *puVar1;
  ushort uVar2;
  short sVar3;
  char cVar4;
  BYTE *d;
  long *plVar5;
  short *psVar6;
  uint uVar7;
  char *pcVar8;
  char cVar9;
  int *piVar10;
  int *piVar11;
  ulong uVar12;
  char *pcVar13;
  long *__src;
  ulong *puVar14;
  BYTE *e_1;
  long *plVar15;
  ulong *puVar16;
  int iVar17;
  long lVar18;
  long *plVar19;
  long lVar20;
  int iVar21;
  BYTE *e;
  short *psVar22;
  int iVar23;
  short *psVar24;
  uint uVar25;
  int *piVar26;
  ulong uVar27;
  char *local_4090;
  int local_4080;
  LZ4_stream_t ctx;
  
  iVar23 = 0;
  memset(&ctx,0,0x4020);
  pcVar8 = dst + dstCapacity;
  iVar17 = (int)src;
  local_4080 = (int)dst;
  ctx.internal_donotuse.currentOffset = srcSize;
  ctx.internal_donotuse.dictSize = srcSize;
  if (srcSize < 0x1000b) {
    iVar23 = 0;
    if ((uint)srcSize < 0x7e000001) {
      ctx.internal_donotuse.tableType = 3;
      piVar26 = (int *)src;
      if ((uint)srcSize < 0xd) {
LAB_0010c44f:
        pcVar13 = src + ((long)srcSize - (long)piVar26);
        iVar23 = 0;
        if ((char *)((long)dst + (long)(pcVar13 + (ulong)(pcVar13 + 0xf0) / 0xff + 1)) <= pcVar8) {
          if (pcVar13 < (char *)0xf) {
            *dst = (char)pcVar13 << 4;
          }
          else {
            *dst = -0x10;
            for (pcVar8 = pcVar13 + -0xf; dst = (char *)((long)dst + 1), (char *)0xfe < pcVar8;
                pcVar8 = pcVar8 + -0xff) {
              *dst = -1;
            }
            *dst = (char)pcVar8;
          }
          memcpy((char *)((long)dst + 1),piVar26,(size_t)pcVar13);
          iVar23 = ((int)(char *)((long)dst + 1) + (int)pcVar13) - local_4080;
        }
      }
      else {
        *(undefined2 *)((long)&ctx + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_0010c16f:
        iVar21 = 1;
        iVar23 = *(int *)((long)piVar26 + 1);
        piVar11 = (int *)((long)piVar26 + 1);
        iVar17 = acceleration << 6;
        do {
          piVar10 = piVar11;
          piVar11 = (int *)((long)iVar21 + (long)piVar10);
          if (src + (long)srcSize + -0xb < piVar11) goto LAB_0010c44f;
          iVar21 = iVar17 >> 6;
          iVar17 = iVar17 + 1;
          uVar27 = (ulong)((uint)(iVar23 * -0x61c8864f) >> 0x13);
          uVar12 = (ulong)*(ushort *)((long)&ctx + uVar27 * 2);
          sVar3 = (short)src;
          iVar23 = *piVar11;
          *(short *)((long)&ctx + uVar27 * 2) = (short)piVar10 - sVar3;
        } while (*(int *)(src + uVar12) != *piVar10);
        lVar18 = 0;
        cVar4 = (char)piVar10 * '\x10' + (char)piVar26 * -0x10;
        do {
          cVar9 = cVar4;
          lVar20 = lVar18;
          pcVar13 = src + lVar20 + uVar12;
          piVar11 = (int *)((long)piVar10 + lVar20);
          if ((pcVar13 <= src) || (piVar11 <= piVar26)) break;
          lVar18 = lVar20 + -1;
          cVar4 = cVar9 + -0x10;
        } while (*(char *)((long)piVar10 + lVar20 + -1) == src[lVar20 + (uVar12 - 1)]);
        uVar25 = (int)piVar10 - (int)piVar26;
        uVar12 = (ulong)(uVar25 + (int)lVar20);
        uVar27 = (ulong)uVar25 + lVar20;
        iVar23 = 0;
        if ((char *)((long)dst + (uVar27 & 0xffffffff) / 0xff + uVar12 + 9) <= pcVar8) {
          if ((uint)uVar27 < 0xf) {
            psVar6 = (short *)((long)dst + 1);
            *dst = cVar9;
          }
          else {
            *dst = -0x10;
            psVar6 = (short *)((long)dst + 2);
            for (iVar23 = ((int)piVar10 - (int)piVar26) + (int)lVar20 + -0xf; 0xfe < iVar23;
                iVar23 = iVar23 + -0xff) {
              *(char *)((long)psVar6 + -1) = -1;
              psVar6 = (short *)((long)psVar6 + 1);
            }
            *(char *)((long)psVar6 + -1) = (char)iVar23;
          }
          psVar22 = (short *)(uVar12 + (long)psVar6);
          do {
            *(undefined8 *)psVar6 = *(undefined8 *)piVar26;
            psVar6 = psVar6 + 4;
            piVar26 = piVar26 + 2;
            psVar24 = (short *)dst;
          } while (psVar6 < psVar22);
          do {
            *psVar22 = (short)piVar11 - (short)pcVar13;
            puVar1 = (ulong *)(piVar11 + 1);
            puVar14 = (ulong *)(pcVar13 + 4);
            puVar16 = puVar1;
            if (src + (long)srcSize + -0xc <= puVar1) {
LAB_0010c30f:
              iVar23 = ((int)puVar16 - (int)piVar11) + -4;
LAB_0010c316:
              if (puVar16 < src + (long)srcSize + -0xc) {
                if (*puVar14 == *puVar16) goto code_r0x0010c326;
                uVar27 = *puVar16 ^ *puVar14;
                uVar12 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                uVar25 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar23;
              }
              else {
                if ((puVar16 < src + (long)srcSize + -8) && ((int)*puVar14 == (int)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 4);
                  puVar14 = (ulong *)((long)puVar14 + 4);
                }
                if ((puVar16 < src + (long)srcSize + -6) && ((short)*puVar14 == (short)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 2);
                  puVar14 = (ulong *)((long)puVar14 + 2);
                }
                if (puVar16 < src + (long)srcSize + -5) {
                  puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar14 == (char)*puVar16));
                }
                uVar25 = (int)puVar16 - (int)puVar1;
              }
              goto LAB_0010c34b;
            }
            if (*puVar14 == *puVar1) {
              puVar14 = (ulong *)(pcVar13 + 0xc);
              puVar16 = (ulong *)(piVar11 + 3);
              goto LAB_0010c30f;
            }
            uVar12 = *puVar1 ^ *puVar14;
            lVar18 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            uVar25 = (uint)lVar18 >> 3;
LAB_0010c34b:
            if (pcVar8 < (char *)((long)psVar22 + (ulong)(uVar25 + 0xf0) / 0xff + 8)) {
              return 0;
            }
            dst = (char *)(psVar22 + 1);
            if (uVar25 < 0xf) {
              *(char *)psVar24 = (char)*psVar24 + (char)uVar25;
            }
            else {
              *(char *)psVar24 = (char)*psVar24 + '\x0f';
              *(short *)((long)dst + 0) = -1;
              *(short *)((long)dst + 2) = -1;
              lVar18 = 0;
              for (uVar7 = uVar25 - 0xf; 0x3fb < uVar7; uVar7 = uVar7 - 0x3fc) {
                pcVar13 = (char *)((long)psVar22 + lVar18 + 6);
                pcVar13[0] = -1;
                pcVar13[1] = -1;
                pcVar13[2] = -1;
                pcVar13[3] = -1;
                lVar18 = lVar18 + 4;
              }
              lVar20 = lVar18 + ((ulong)uVar7 & 0xffff) / 0xff;
              dst = (char *)((long)psVar22 + lVar20 + 3);
              *(char *)((long)psVar22 + lVar20 + 2) =
                   (char)lVar18 + (char)((ushort)uVar7 / 0xff) + (char)uVar25 + -0xf;
            }
            lVar18 = (long)piVar11 + (ulong)uVar25;
            piVar11 = (int *)(lVar18 + 4);
            piVar26 = piVar11;
            if (src + (long)srcSize + -0xb <= piVar11) goto LAB_0010c44f;
            *(short *)((long)&ctx + (ulong)((uint)(*(int *)(lVar18 + 2) * -0x61c8864f) >> 0x13) * 2)
                 = ((short)lVar18 + 2) - sVar3;
            uVar12 = (ulong)((uint)(*piVar11 * -0x61c8864f) >> 0x13);
            uVar2 = *(ushort *)((long)&ctx + uVar12 * 2);
            pcVar13 = src + uVar2;
            *(short *)((long)&ctx + uVar12 * 2) = (short)piVar11 - sVar3;
            if (*(int *)(src + uVar2) != *piVar11) goto LAB_0010c16f;
            psVar22 = (short *)((long)dst + 1);
            *dst = '\0';
            psVar24 = (short *)dst;
          } while( true );
        }
      }
    }
  }
  else if ((uint)srcSize < 0x7e000001) {
    ctx.internal_donotuse.tableType = 2;
    *(undefined4 *)((long)&ctx + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = 0;
    plVar15 = (long *)src;
LAB_0010bda6:
    iVar21 = 1;
    lVar18 = *(long *)((long)plVar15 + 1);
    plVar5 = (long *)((long)plVar15 + 1);
    iVar23 = acceleration << 6;
    while( true ) {
      plVar19 = (long *)((long)iVar21 + (long)plVar5);
      __src = plVar15;
      if (src + ((ulong)(uint)srcSize - 0xb) < plVar19) goto LAB_0010c0af;
      uVar27 = (ulong)(lVar18 * -0x30e4432345000000) >> 0x34;
      uVar25 = *(uint *)((long)&ctx + uVar27 * 4);
      uVar12 = (ulong)uVar25;
      iVar21 = (int)plVar5;
      lVar18 = *plVar19;
      *(int *)((long)&ctx + uVar27 * 4) = iVar21 - iVar17;
      if (((uint)(iVar21 - iVar17) <= uVar25 + 0xffff) && (*(int *)(src + uVar12) == (int)*plVar5))
      break;
      iVar21 = iVar23 >> 6;
      iVar23 = iVar23 + 1;
      plVar5 = plVar19;
    }
    lVar18 = 0;
    cVar4 = (char)plVar5 * '\x10' + (char)plVar15 * -0x10;
    do {
      cVar9 = cVar4;
      lVar20 = lVar18;
      piVar26 = (int *)(src + lVar20 + uVar12);
      __src = (long *)((long)plVar5 + lVar20);
      if ((piVar26 <= src) || (__src <= plVar15)) break;
      lVar18 = lVar20 + -1;
      cVar4 = cVar9 + -0x10;
    } while (*(char *)((long)plVar5 + lVar20 + -1) == src[lVar20 + (uVar12 - 1)]);
    uVar25 = iVar21 - (int)plVar15;
    uVar12 = (ulong)(uVar25 + (int)lVar20);
    uVar27 = (ulong)uVar25 + lVar20;
    iVar23 = 0;
    if (dst + (uVar27 & 0xffffffff) / 0xff + uVar12 + 9 <= pcVar8) {
      if ((uint)uVar27 < 0xf) {
        plVar5 = (long *)(dst + 1);
        *dst = cVar9;
      }
      else {
        *dst = -0x10;
        plVar5 = (long *)(dst + 2);
        for (iVar23 = (iVar21 - (int)plVar15) + (int)lVar20 + -0xf; 0xfe < iVar23;
            iVar23 = iVar23 + -0xff) {
          *(char *)((long)plVar5 + -1) = -1;
          plVar5 = (long *)((long)plVar5 + 1);
        }
        *(char *)((long)plVar5 + -1) = (char)iVar23;
      }
      plVar19 = (long *)(uVar12 + (long)plVar5);
      do {
        *plVar5 = *plVar15;
        plVar5 = plVar5 + 1;
        plVar15 = plVar15 + 1;
        local_4090 = dst;
      } while (plVar5 < plVar19);
      do {
        *(short *)plVar19 = (short)__src - (short)piVar26;
        puVar1 = (ulong *)((long)__src + 4);
        puVar14 = (ulong *)(piVar26 + 1);
        puVar16 = puVar1;
        if (src + ((ulong)(uint)srcSize - 0xc) <= puVar1) {
LAB_0010bf69:
          iVar23 = ((int)puVar16 - (int)__src) + -4;
LAB_0010bf70:
          if (puVar16 < src + ((ulong)(uint)srcSize - 0xc)) {
            if (*puVar14 == *puVar16) goto code_r0x0010bf80;
            uVar27 = *puVar16 ^ *puVar14;
            uVar12 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar25 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar23;
          }
          else {
            if ((puVar16 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar14 == (int)*puVar16)) {
              puVar16 = (ulong *)((long)puVar16 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar16 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar14 == (short)*puVar16)
               ) {
              puVar16 = (ulong *)((long)puVar16 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar16 < src + ((ulong)(uint)srcSize - 5)) {
              puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar14 == (char)*puVar16));
            }
            uVar25 = (int)puVar16 - (int)puVar1;
          }
          goto LAB_0010bfa5;
        }
        if (*puVar14 == *puVar1) {
          puVar14 = (ulong *)(piVar26 + 3);
          puVar16 = (ulong *)((long)__src + 0xc);
          goto LAB_0010bf69;
        }
        uVar12 = *puVar1 ^ *puVar14;
        lVar18 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar25 = (uint)lVar18 >> 3;
LAB_0010bfa5:
        if (pcVar8 < (char *)((long)plVar19 + (ulong)(uVar25 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        dst = (char *)((long)plVar19 + 2);
        if (uVar25 < 0xf) {
          *local_4090 = *local_4090 + (char)uVar25;
        }
        else {
          *local_4090 = *local_4090 + '\x0f';
          dst[0] = -1;
          dst[1] = -1;
          dst[2] = -1;
          dst[3] = -1;
          lVar18 = 0;
          for (uVar7 = uVar25 - 0xf; 0x3fb < uVar7; uVar7 = uVar7 - 0x3fc) {
            pcVar13 = (char *)((long)plVar19 + lVar18 + 6);
            pcVar13[0] = -1;
            pcVar13[1] = -1;
            pcVar13[2] = -1;
            pcVar13[3] = -1;
            lVar18 = lVar18 + 4;
          }
          lVar20 = lVar18 + ((ulong)uVar7 & 0xffff) / 0xff;
          dst = (char *)((long)plVar19 + lVar20 + 3);
          *(char *)((long)plVar19 + lVar20 + 2) =
               (char)lVar18 + (char)((uVar7 & 0xffff) / 0xff) + (char)uVar25 + -0xf;
        }
        lVar18 = (long)__src + (ulong)uVar25;
        __src = (long *)(lVar18 + 4);
        if (src + ((ulong)(uint)srcSize - 0xb) <= __src) {
LAB_0010c0af:
          pcVar13 = src + ((ulong)(uint)srcSize - (long)__src);
          if (pcVar8 < dst + (long)(pcVar13 + (ulong)(pcVar13 + 0xf0) / 0xff + 1)) {
            return 0;
          }
          if (pcVar13 < (char *)0xf) {
            *dst = (char)pcVar13 << 4;
          }
          else {
            *dst = -0x10;
            for (pcVar8 = pcVar13 + -0xf; dst = dst + 1, (char *)0xfe < pcVar8;
                pcVar8 = pcVar8 + -0xff) {
              *dst = -1;
            }
            *dst = (char)pcVar8;
          }
          memcpy(dst + 1,__src,(size_t)pcVar13);
          return ((int)(dst + 1) + (int)pcVar13) - local_4080;
        }
        *(int *)((long)&ctx + ((ulong)(*(long *)(lVar18 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar18 + 2) - iVar17;
        uVar12 = (ulong)(*__src * -0x30e4432345000000) >> 0x34;
        uVar7 = (int)__src - iVar17;
        uVar25 = *(uint *)((long)&ctx + uVar12 * 4);
        piVar26 = (int *)(src + uVar25);
        *(uint *)((long)&ctx + uVar12 * 4) = uVar7;
        plVar15 = __src;
        if ((uVar25 + 0xffff < uVar7) || (*piVar26 != *(int *)__src)) goto LAB_0010bda6;
        plVar19 = (long *)(dst + 1);
        *dst = '\0';
        local_4090 = dst;
      } while( true );
    }
  }
  return iVar23;
code_r0x0010bf80:
  puVar16 = puVar16 + 1;
  puVar14 = puVar14 + 1;
  iVar23 = iVar23 + 8;
  goto LAB_0010bf70;
code_r0x0010c326:
  puVar16 = puVar16 + 1;
  puVar14 = puVar14 + 1;
  iVar23 = iVar23 + 8;
  goto LAB_0010c316;
}

Assistant:

int LZ4_compress_fast_force(const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t ctx;
    LZ4_initStream(&ctx, sizeof(ctx));

    if (srcSize < LZ4_64Klimit) {
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, byU16,    noDict, noDictIssue, acceleration);
    } else {
        tableType_t const addrMode = (sizeof(void*) > 4) ? byU32 : byPtr;
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, addrMode, noDict, noDictIssue, acceleration);
    }
}